

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_constructor.h
# Opt level: O0

duk_ret_t dukglue::detail::call_native_constructor<false,Rectangle,int,int,int,int>
                    (duk_context *ctx)

{
  duk_bool_t dVar1;
  Rectangle *val;
  Rectangle *obj;
  type constructor_args;
  duk_context *ctx_local;
  
  constructor_args.super__Tuple_impl<0UL,_int,_int,_int,_int>._8_8_ = ctx;
  dVar1 = duk_is_constructor_call(ctx);
  if (dVar1 == 0) {
    duk_error_raw((duk_context *)constructor_args.super__Tuple_impl<0UL,_int,_int,_int,_int>._8_8_,
                  -6,
                  "/workspace/llm4binary/github/license_c_cmakelists/Aloshi[P]dukglue/tests/../include/dukglue/detail_constructor.h"
                  ,0xd,"Constructor must be called with new T().");
  }
  get_stack_values<int,int,int,int>
            ((detail *)&obj,
             (duk_context *)constructor_args.super__Tuple_impl<0UL,_int,_int,_int,_int>._8_8_);
  val = apply_constructor<Rectangle,int,int,int,int>((tuple<int,_int,_int,_int> *)&obj);
  duk_push_this((duk_context *)constructor_args.super__Tuple_impl<0UL,_int,_int,_int,_int>._8_8_);
  duk_push_pointer((duk_context *)constructor_args.super__Tuple_impl<0UL,_int,_int,_int,_int>._8_8_,
                   val);
  duk_put_prop_string((duk_context *)
                      constructor_args.super__Tuple_impl<0UL,_int,_int,_int,_int>._8_8_,-2,
                      anon_var_dwarf_c456);
  RefManager::register_native_object
            ((duk_context *)constructor_args.super__Tuple_impl<0UL,_int,_int,_int,_int>._8_8_,val);
  duk_pop((duk_context *)constructor_args.super__Tuple_impl<0UL,_int,_int,_int,_int>._8_8_);
  return 0;
}

Assistant:

static duk_ret_t call_native_constructor(duk_context* ctx)
    {
      if (!duk_is_constructor_call(ctx)) {
        duk_error(ctx, DUK_RET_TYPE_ERROR, "Constructor must be called with new T().");
        return DUK_RET_TYPE_ERROR;
      }

      // construct the new instance
      auto constructor_args = dukglue::detail::get_stack_values<Ts...>(ctx);
      Cls* obj = dukglue::detail::apply_constructor<Cls>(std::move(constructor_args));

      duk_push_this(ctx);

      // make the new script object keep the pointer to the new object instance
      duk_push_pointer(ctx, obj);
      duk_put_prop_string(ctx, -2, "\xFF" "obj_ptr");

      // register it
	  if (!managed)
		dukglue::detail::RefManager::register_native_object(ctx, obj);

      duk_pop(ctx); // pop this

      return 0;
    }